

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseModuleType(JSONParser *this,ModuleType *out_type)

{
  bool bVar1;
  Result result;
  undefined8 uVar2;
  undefined1 local_40 [8];
  string module_type_str;
  ModuleType *out_type_local;
  JSONParser *this_local;
  
  module_type_str.field_2._8_8_ = out_type;
  std::__cxx11::string::string((string *)local_40);
  result = ParseKeyStringValue(this,"module_type",(string *)local_40);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"text");
    if (bVar1) {
      *(undefined4 *)module_type_str.field_2._8_8_ = 0;
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"binary");
      if (bVar1) {
        *(undefined4 *)module_type_str.field_2._8_8_ = 1;
        wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        PrintError(this,"unknown module type: \"%s\"",uVar2);
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseModuleType(ModuleType* out_type) {
  std::string module_type_str;

  PARSE_KEY_STRING_VALUE("module_type", &module_type_str);
  if (module_type_str == "text") {
    *out_type = ModuleType::Text;
    return wabt::Result::Ok;
  } else if (module_type_str == "binary") {
    *out_type = ModuleType::Binary;
    return wabt::Result::Ok;
  } else {
    PrintError("unknown module type: \"%s\"", module_type_str.c_str());
    return wabt::Result::Error;
  }
}